

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_cstring(basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
               *this,string_type *buffer,error_code *ec)

{
  size_t *psVar1;
  type_conflict2 tVar2;
  uint8_t c;
  
  c = 0xff;
  while( true ) {
    tVar2 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::read<std::random_access_iterator_tag>(&this->source_,&c,1);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + tVar2;
    if (tVar2 != 1) {
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return;
    }
    if (c == '\0') break;
    std::__cxx11::string::push_back((char)buffer);
  }
  return;
}

Assistant:

void read_cstring(string_type& buffer, std::error_code& ec)
    {
        uint8_t c = 0xff;
        while (true)
        {
            std::size_t n = source_.read(&c, 1);
            state_stack_.back().pos += n;
            if (JSONCONS_UNLIKELY(n != 1))
            {
                ec = bson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c == 0)
            {
                break;
            }
            buffer.push_back(c);
        }
    }